

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O3

bool __thiscall WTF::LineReader::ReadLine(LineReader *this,char **bol,char **eol)

{
  void *pvVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t __n;
  char *pcVar4;
  char *__s;
  
  pcVar3 = this->buf_;
  pcVar4 = this->eod_;
  if (pcVar3 == pcVar4) {
    sVar2 = ReadPersistent(this->fd_,pcVar3,(long)this->buf_len_);
    if (sVar2 < 1) {
      return false;
    }
    __s = this->buf_;
    pcVar4 = __s + sVar2;
    this->eod_ = pcVar4;
    this->bol_ = __s;
  }
  else {
    __s = this->eol_ + 1;
    this->bol_ = __s;
    if (pcVar4 < __s) {
      abort();
    }
    pvVar1 = memchr(__s,10,(long)pcVar4 - (long)__s);
    if (pvVar1 == (void *)0x0) {
      __n = (size_t)(int)((long)pcVar4 - (long)__s);
      memmove(pcVar3,__s,__n);
      pcVar3 = this->buf_;
      sVar2 = ReadPersistent(this->fd_,pcVar3 + __n,(long)this->buf_len_ - __n);
      if (sVar2 < 1) {
        return false;
      }
      pcVar4 = pcVar3 + __n + sVar2;
      this->eod_ = pcVar4;
      __s = this->buf_;
      this->bol_ = __s;
    }
  }
  pcVar3 = (char *)memchr(__s,10,(long)pcVar4 - (long)__s);
  this->eol_ = pcVar3;
  if (pcVar3 == (char *)0x0) {
    return false;
  }
  *pcVar3 = '\0';
  *bol = this->bol_;
  *eol = this->eol_;
  return true;
}

Assistant:

bool ReadLine(const char **bol, const char **eol) {
    if (BufferIsEmpty()) {  // First time.
      const ssize_t num_bytes = ReadPersistent(fd_, buf_, buf_len_);
      if (num_bytes <= 0) {  // EOF or error.
        return false;
      }
      eod_ = buf_ + num_bytes;
      bol_ = buf_;
    } else {
      bol_ = eol_ + 1;  // Advance to the next line in the buffer.
      SAFE_ASSERT(bol_ <= eod_);  // "bol_" can point to "eod_".
      if (!HasCompleteLine()) {
        const int incomplete_line_length = eod_ - bol_;
        // Move the trailing incomplete line to the beginning.
        memmove(buf_, bol_, incomplete_line_length);
        // Read text from file and append it.
        char * const append_pos = buf_ + incomplete_line_length;
        const int capacity_left = buf_len_ - incomplete_line_length;
        const ssize_t num_bytes = ReadPersistent(fd_, append_pos,
                                                 capacity_left);
        if (num_bytes <= 0) {  // EOF or error.
          return false;
        }
        eod_ = append_pos + num_bytes;
        bol_ = buf_;
      }
    }
    eol_ = FindLineFeed();
    if (eol_ == NULL) {  // '\n' not found.  Malformed line.
      return false;
    }
    *eol_ = '\0';  // Replace '\n' with '\0'.

    *bol = bol_;
    *eol = eol_;
    return true;
  }